

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  
  uVar2 = pMem1->flags;
  uVar3 = pMem2->flags;
  uVar8 = uVar3 | uVar2;
  if ((uVar8 & 1) != 0) {
    return (uVar3 & 1) - (uVar2 & 1);
  }
  if ((uVar8 & 0x2c) == 0) {
    if ((uVar8 & 2) != 0) {
      if ((uVar2 & 2) == 0) {
        return 1;
      }
      if ((uVar3 & 2) == 0) {
        return -1;
      }
      if (pColl != (CollSeq *)0x0) {
        iVar9 = vdbeCompareMemString(pMem1,pMem2,pColl,(u8 *)0x0);
        return iVar9;
      }
      iVar9 = sqlite3BlobCompare(pMem1,pMem2);
      return iVar9;
    }
    iVar12 = pMem1->n;
    iVar9 = pMem2->n;
    uVar2 = pMem1->flags;
    if (((pMem2->flags | uVar2) >> 0xe & 1) == 0) {
      iVar11 = iVar9;
      if (iVar12 < iVar9) {
        iVar11 = iVar12;
      }
      iVar11 = memcmp(pMem1->z,pMem2->z,(long)iVar11);
      if (iVar11 == 0) {
        return iVar12 - iVar9;
      }
      return iVar11;
    }
    if ((uVar2 & 0x4000 & pMem2->flags) == 0) {
      if ((uVar2 & 0x4000) != 0) {
        iVar12 = isAllZero(pMem2->z,iVar9);
        if (iVar12 == 0) {
          return -1;
        }
        return (pMem1->u).nZero - iVar9;
      }
      iVar9 = isAllZero(pMem1->z,iVar12);
      if (iVar9 == 0) {
        return 1;
      }
    }
    else {
      iVar12 = (pMem1->u).nZero;
    }
    return iVar12 - (pMem2->u).nZero;
  }
  if ((uVar3 & uVar2 & 0x24) == 0) {
    if ((uVar3 & uVar2 & 8) == 0) {
      if ((uVar2 & 0x24) == 0) {
        if ((uVar2 & 8) == 0) {
          return 1;
        }
        if ((uVar3 & 0x24) == 0) {
          return -1;
        }
        dVar7 = (double)(pMem2->u).i;
        dVar1 = (pMem1->u).r;
        uVar13 = -(uint)(dVar1 < dVar7);
        bVar14 = dVar1 == dVar7;
        bVar15 = dVar1 < dVar7;
        uVar10 = 1;
      }
      else {
        if ((uVar3 & 8) == 0) {
          if ((uVar3 & 0x24) == 0) {
            return -1;
          }
          lVar4 = (pMem2->u).i;
          lVar5 = (pMem1->u).i;
          bVar15 = SBORROW8(lVar5,lVar4);
          lVar6 = lVar5 - lVar4;
          bVar14 = lVar5 == lVar4;
          if (lVar5 < lVar4) {
            return -1;
          }
          goto LAB_0016c060;
        }
        dVar7 = (double)(pMem1->u).i;
        dVar1 = (pMem2->u).r;
        uVar13 = (uint)(dVar1 < dVar7);
        bVar14 = dVar1 == dVar7;
        bVar15 = dVar1 < dVar7;
        uVar10 = 0xffffffff;
      }
      if (bVar15 || bVar14) {
        uVar10 = uVar13;
      }
      return uVar10;
    }
    if ((pMem2->u).r <= (pMem1->u).r) {
      return (int)((pMem2->u).r < (pMem1->u).r);
    }
  }
  else {
    lVar4 = (pMem2->u).i;
    lVar5 = (pMem1->u).i;
    bVar15 = SBORROW8(lVar5,lVar4);
    lVar6 = lVar5 - lVar4;
    bVar14 = lVar5 == lVar4;
    if (lVar4 <= lVar5) {
LAB_0016c060:
      return (int)(!bVar14 && bVar15 == lVar6 < 0);
    }
  }
  return -1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( !sqlite3VdbeMemIsRowSet(pMem1) && !sqlite3VdbeMemIsRowSet(pMem2) );
 
  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( combined_flags & MEM_Int );
    testcase( combined_flags & MEM_Real );
    testcase( combined_flags & MEM_IntReal );
    if( (f1 & f2 & (MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & f2 & MEM_Int );
      testcase( f1 & f2 & MEM_IntReal );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&(MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & MEM_Int );
      testcase( f1 & MEM_IntReal );
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        if( pMem1->u.i < pMem2->u.i ) return -1;
        if( pMem1->u.i > pMem2->u.i ) return +1;
        return 0;
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        testcase( f2 & MEM_Int );
        testcase( f2 & MEM_IntReal );
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 || 
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }
 
  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}